

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

Node * __thiscall
wasm::Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
          (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *this,Expression *curr)

{
  Expression *curr_local;
  Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *this_local;
  
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitBlock((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                               *)this,(Block *)curr);
      break;
    case IfId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visitIf
                             ((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                               *)this,(If *)curr);
      break;
    case LoopId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitLoop((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                              *)this,(Loop *)curr);
      break;
    case BreakId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitBreak((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                               *)this,(Break *)curr);
      break;
    case SwitchId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitSwitch((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                *)this,(Switch *)curr);
      break;
    case CallId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitCall((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                              *)this,(Call *)curr);
      break;
    case CallIndirectId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitCallIndirect((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                      *)this,(CallIndirect *)curr);
      break;
    case LocalGetId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitLocalGet((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                  *)this,(LocalGet *)curr);
      break;
    case LocalSetId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitLocalSet((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                  *)this,(LocalSet *)curr);
      break;
    case GlobalGetId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitGlobalGet((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(GlobalGet *)curr);
      break;
    case GlobalSetId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitGlobalSet((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(GlobalSet *)curr);
      break;
    case LoadId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitLoad((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                              *)this,(Load *)curr);
      break;
    case StoreId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitStore((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                               *)this,(Store *)curr);
      break;
    case ConstId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitConst((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                               *)this,(Const *)curr);
      break;
    case UnaryId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitUnary((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                               *)this,(Unary *)curr);
      break;
    case BinaryId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitBinary((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                *)this,(Binary *)curr);
      break;
    case SelectId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitSelect((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                *)this,(Select *)curr);
      break;
    case DropId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitDrop((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                              *)this,(Drop *)curr);
      break;
    case ReturnId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitReturn((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                *)this,(Return *)curr);
      break;
    case MemorySizeId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitMemorySize((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                    *)this,(MemorySize *)curr);
      break;
    case MemoryGrowId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitMemoryGrow((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                    *)this,(MemoryGrow *)curr);
      break;
    case NopId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visitNop
                             ((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                               *)this,(Nop *)curr);
      break;
    case UnreachableId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitUnreachable((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                     *)this,(Unreachable *)curr);
      break;
    case AtomicRMWId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitAtomicRMW((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(AtomicRMW *)curr);
      break;
    case AtomicCmpxchgId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitAtomicCmpxchg((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                       *)this,(AtomicCmpxchg *)curr);
      break;
    case AtomicWaitId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitAtomicWait((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                    *)this,(AtomicWait *)curr);
      break;
    case AtomicNotifyId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitAtomicNotify((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                      *)this,(AtomicNotify *)curr);
      break;
    case AtomicFenceId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitAtomicFence((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                     *)this,(AtomicFence *)curr);
      break;
    case SIMDExtractId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitSIMDExtract((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                     *)this,(SIMDExtract *)curr);
      break;
    case SIMDReplaceId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitSIMDReplace((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                     *)this,(SIMDReplace *)curr);
      break;
    case SIMDShuffleId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitSIMDShuffle((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                     *)this,(SIMDShuffle *)curr);
      break;
    case SIMDTernaryId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitSIMDTernary((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                     *)this,(SIMDTernary *)curr);
      break;
    case SIMDShiftId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitSIMDShift((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(SIMDShift *)curr);
      break;
    case SIMDLoadId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitSIMDLoad((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                  *)this,(SIMDLoad *)curr);
      break;
    case SIMDLoadStoreLaneId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitSIMDLoadStoreLane
                             ((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                               *)this,(SIMDLoadStoreLane *)curr);
      break;
    case MemoryInitId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitMemoryInit((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                    *)this,(MemoryInit *)curr);
      break;
    case DataDropId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitDataDrop((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                  *)this,(DataDrop *)curr);
      break;
    case MemoryCopyId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitMemoryCopy((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                    *)this,(MemoryCopy *)curr);
      break;
    case MemoryFillId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitMemoryFill((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                    *)this,(MemoryFill *)curr);
      break;
    case PopId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visitPop
                             ((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                               *)this,(Pop *)curr);
      break;
    case RefNullId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitRefNull((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                 *)this,(RefNull *)curr);
      break;
    case RefIsNullId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitRefIsNull((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(RefIsNull *)curr);
      break;
    case RefFuncId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitRefFunc((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                 *)this,(RefFunc *)curr);
      break;
    case RefEqId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitRefEq((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                               *)this,(RefEq *)curr);
      break;
    case TableGetId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitTableGet((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                  *)this,(TableGet *)curr);
      break;
    case TableSetId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitTableSet((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                  *)this,(TableSet *)curr);
      break;
    case TableSizeId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitTableSize((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(TableSize *)curr);
      break;
    case TableGrowId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitTableGrow((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(TableGrow *)curr);
      break;
    case TableFillId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitTableFill((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(TableFill *)curr);
      break;
    case TableCopyId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitTableCopy((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(TableCopy *)curr);
      break;
    case TableInitId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitTableInit((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(TableInit *)curr);
      break;
    case TryId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visitTry
                             ((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                               *)this,(Try *)curr);
      break;
    case TryTableId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitTryTable((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                  *)this,(TryTable *)curr);
      break;
    case ThrowId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitThrow((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                               *)this,(Throw *)curr);
      break;
    case RethrowId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitRethrow((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                 *)this,(Rethrow *)curr);
      break;
    case ThrowRefId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitThrowRef((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                  *)this,(ThrowRef *)curr);
      break;
    case TupleMakeId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitTupleMake((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(TupleMake *)curr);
      break;
    case TupleExtractId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitTupleExtract((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                      *)this,(TupleExtract *)curr);
      break;
    case RefI31Id:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitRefI31((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                *)this,(RefI31 *)curr);
      break;
    case I31GetId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitI31Get((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                *)this,(I31Get *)curr);
      break;
    case CallRefId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitCallRef((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                 *)this,(CallRef *)curr);
      break;
    case RefTestId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitRefTest((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                 *)this,(RefTest *)curr);
      break;
    case RefCastId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitRefCast((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                 *)this,(RefCast *)curr);
      break;
    case BrOnId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitBrOn((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                              *)this,(BrOn *)curr);
      break;
    case StructNewId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitStructNew((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(StructNew *)curr);
      break;
    case StructGetId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitStructGet((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(StructGet *)curr);
      break;
    case StructSetId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitStructSet((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(StructSet *)curr);
      break;
    case StructRMWId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitStructRMW((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(StructRMW *)curr);
      break;
    case StructCmpxchgId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitStructCmpxchg((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                       *)this,(StructCmpxchg *)curr);
      break;
    case ArrayNewId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitArrayNew((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                  *)this,(ArrayNew *)curr);
      break;
    case ArrayNewDataId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitArrayNewData((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                      *)this,(ArrayNewData *)curr);
      break;
    case ArrayNewElemId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitArrayNewElem((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                      *)this,(ArrayNewElem *)curr);
      break;
    case ArrayNewFixedId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitArrayNewFixed((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                       *)this,(ArrayNewFixed *)curr);
      break;
    case ArrayGetId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitArrayGet((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                  *)this,(ArrayGet *)curr);
      break;
    case ArraySetId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitArraySet((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                  *)this,(ArraySet *)curr);
      break;
    case ArrayLenId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitArrayLen((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                  *)this,(ArrayLen *)curr);
      break;
    case ArrayCopyId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitArrayCopy((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(ArrayCopy *)curr);
      break;
    case ArrayFillId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitArrayFill((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(ArrayFill *)curr);
      break;
    case ArrayInitDataId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitArrayInitData((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                       *)this,(ArrayInitData *)curr);
      break;
    case ArrayInitElemId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitArrayInitElem((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                       *)this,(ArrayInitElem *)curr);
      break;
    case RefAsId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitRefAs((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                               *)this,(RefAs *)curr);
      break;
    case StringNewId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitStringNew((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                   *)this,(StringNew *)curr);
      break;
    case StringConstId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitStringConst((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                     *)this,(StringConst *)curr);
      break;
    case StringMeasureId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitStringMeasure((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                       *)this,(StringMeasure *)curr);
      break;
    case StringEncodeId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitStringEncode((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                      *)this,(StringEncode *)curr);
      break;
    case StringConcatId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitStringConcat((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                      *)this,(StringConcat *)curr);
      break;
    case StringEqId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitStringEq((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                  *)this,(StringEq *)curr);
      break;
    case StringWTF16GetId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitStringWTF16Get((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                        *)this,(StringWTF16Get *)curr);
      break;
    case StringSliceWTFId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitStringSliceWTF((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                        *)this,(StringSliceWTF *)curr);
      break;
    case ContNewId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitContNew((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                 *)this,(ContNew *)curr);
      break;
    case ContBindId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitContBind((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                  *)this,(ContBind *)curr);
      break;
    case SuspendId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitSuspend((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                 *)this,(Suspend *)curr);
      break;
    case ResumeId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitResume((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                *)this,(Resume *)curr);
      break;
    case ResumeThrowId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitResumeThrow((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                     *)this,(ResumeThrow *)curr);
      break;
    case StackSwitchId:
      this_local = (Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)
                   UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                   visitStackSwitch((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                     *)this,(StackSwitch *)curr);
      break;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
    return (Node *)this_local;
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::DataFlow::Graph, wasm::DataFlow::Node *>::visit(Expression *) [SubType = wasm::DataFlow::Graph, ReturnType = wasm::DataFlow::Node *]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }